

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::Filter::setFilterOperations(Filter *this,shared_ptr<helics::FilterOperations> *filterOps)

{
  uint uVar1;
  Core *pCVar2;
  element_type *peVar3;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::__shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->filtOp).
              super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>,
             &filterOps->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>);
  pCVar2 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  peVar3 = (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_28 = 0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (*peVar3->_vptr_FilterOperations[6])(&local_28);
  }
  (*pCVar2->_vptr_Core[0x54])(pCVar2,(ulong)uVar1,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  return;
}

Assistant:

void Filter::setFilterOperations(std::shared_ptr<FilterOperations> filterOps)
{
    filtOp = std::move(filterOps);
    mCore->setFilterOperator(handle, (filtOp) ? filtOp->getOperator() : nullptr);
}